

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v6::internal::
       parse_precision<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
                 *handler)

{
  char cVar1;
  type tVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  char *begin_00;
  byte *pbVar7;
  error_handler local_1c;
  error_handler local_1b;
  error_handler local_1a;
  error_handler local_19;
  precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
  local_18;
  
  if (begin + 1 == end) {
LAB_0012df30:
    error_handler::on_error(&local_1a,"missing precision specifier");
  }
  cVar1 = begin[1];
  uVar5 = (uint)cVar1;
  if (uVar5 - 0x30 < 10) {
    uVar4 = 0;
    pbVar3 = (byte *)(begin + 2);
    do {
      pbVar6 = pbVar3;
      if (0xccccccc < uVar4) goto LAB_0012df1f;
      uVar4 = ((int)(char)uVar5 + uVar4 * 10) - 0x30;
      pbVar7 = (byte *)end;
      if (pbVar6 == (byte *)end) break;
      uVar5 = (uint)*pbVar6;
      pbVar3 = pbVar6 + 1;
      pbVar7 = pbVar6;
    } while ((byte)(*pbVar6 - 0x30) < 10);
    if ((int)uVar4 < 0) {
LAB_0012df1f:
      error_handler::on_error(&local_1c,"number is too big");
    }
    ((handler->
     super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
     ).super_specs_setter<char>.specs_)->precision = uVar4;
  }
  else {
    if (cVar1 != '{') goto LAB_0012df30;
    begin_00 = begin + 2;
    if (begin_00 != end) {
      local_18.handler = handler;
      begin_00 = parse_arg_id<char,fmt::v6::internal::precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&,char>>
                           (begin_00,end,&local_18);
    }
    if ((begin_00 == end) || (*begin_00 != '}')) {
      error_handler::on_error(&local_1b,"invalid format string");
    }
    pbVar7 = (byte *)(begin_00 + 1);
  }
  tVar2 = (handler->checker_).arg_type_;
  if ((tVar2 != pointer_type) && (8 < tVar2 - named_arg_type)) {
    return (char *)pbVar7;
  }
  error_handler::on_error(&local_19,"precision not allowed for this argument type");
}

Assistant:

FMT_CONSTEXPR const Char* parse_precision(const Char* begin, const Char* end,
                                          Handler&& handler) {
  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    handler.on_precision(parse_nonnegative_int(begin, end, handler));
  } else if (c == '{') {
    ++begin;
    if (begin != end) {
      begin =
          parse_arg_id(begin, end, precision_adapter<Handler, Char>(handler));
    }
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}